

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_generator.cc
# Opt level: O2

void __thiscall
re2::RegexpGenerator::RunPostfix
          (RegexpGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *post)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  _Elt_pointer pbVar4;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *extraout_RDX_01;
  StringPiece *pSVar5;
  StringPiece *extraout_RDX_02;
  size_t i;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  pointer pbVar7;
  long lVar8;
  string a;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  regexps;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string b;
  
  std::
  stack<std::__cxx11::string,std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::stack<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>(&regexps);
  lVar8 = 0;
  uVar6 = 0;
  do {
    pbVar7 = (post->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(post->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5) <= uVar6) {
      sVar3 = std::
              deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&regexps.c);
      if (sVar3 != 1) {
        puts("Bad regexp program:");
        lVar8 = 8;
        pSVar5 = extraout_RDX;
        for (uVar6 = 0;
            pbVar7 = (post->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            uVar6 < (ulong)((long)(post->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5);
            uVar6 = uVar6 + 1) {
          a._M_dataplus._M_p = *(pointer *)((long)pbVar7 + lVar8 + -8);
          a._M_string_length._0_4_ = *(undefined4 *)((long)&(pbVar7->_M_dataplus)._M_p + lVar8);
          CEscape_abi_cxx11_(&b,(re2 *)&a,pSVar5);
          printf("  %s\n",b._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&b);
          lVar8 = lVar8 + 0x20;
          pSVar5 = extraout_RDX_00;
        }
        puts("Stack after running program:");
        pSVar5 = extraout_RDX_01;
        while (regexps.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               regexps.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pbVar4 = regexps.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (regexps.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              regexps.c.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pbVar4 = regexps.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
          }
          a._M_dataplus._M_p = pbVar4[-1]._M_dataplus._M_p;
          a._M_string_length._0_4_ = (undefined4)pbVar4[-1]._M_string_length;
          CEscape_abi_cxx11_(&b,(re2 *)&a,pSVar5);
          printf("  %s\n",b._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&b);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&regexps.c);
          pSVar5 = extraout_RDX_02;
        }
        LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&b,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_generator.cc"
                   ,0xdb);
        std::operator<<((ostream *)&b._M_string_length,"Bad regexp program.");
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&b);
      }
      pbVar4 = regexps.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar4 = regexps.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      (*this->_vptr_RegexpGenerator[2])(this,pbVar4 + -1);
      pbVar4 = regexps.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar4 = regexps.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      std::operator+(&a,"^(?:",pbVar4 + -1);
      std::operator+(&b,&a,")$");
      (*this->_vptr_RegexpGenerator[2])(this,&b);
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::~string((string *)&a);
      pbVar4 = regexps.c.
               super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar4 = regexps.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      std::operator+(&a,"^(?:",pbVar4 + -1);
      std::operator+(&b,&a,")");
      (*this->_vptr_RegexpGenerator[2])(this,&b);
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::~string((string *)&a);
      if (regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          regexps.c.
          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        regexps.c.
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur =
             regexps.c.
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      std::operator+(&a,"(?:",regexps.c.
                              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur + -1);
      std::operator+(&b,&a,")$");
      (*this->_vptr_RegexpGenerator[2])(this,&b);
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::~string((string *)&a);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque(&regexps.c);
      return;
    }
    iVar1 = CountArgs((string *)((long)&(pbVar7->_M_dataplus)._M_p + lVar8));
    if (iVar1 == 0) {
LAB_001074e3:
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&regexps.c,(value_type *)((long)&(pbVar7->_M_dataplus)._M_p + lVar8));
    }
    else {
      if (iVar1 == 1) {
        __return_storage_ptr__ = &local_210;
        pbVar4 = regexps.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (regexps.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            regexps.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar4 = regexps.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        std::__cxx11::string::string((string *)&b,(string *)(pbVar4 + -1));
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&regexps.c);
        StringPrintf_abi_cxx11_
                  (__return_storage_ptr__,
                   *(char **)((long)&(((post->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar8),b._M_dataplus._M_p);
        std::operator+(&local_1d0,"(?:",__return_storage_ptr__);
        std::operator+(&a,&local_1d0,")");
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&regexps,&a);
        std::__cxx11::string::~string((string *)&a);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      else {
        if (iVar1 != 2) {
          LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&b,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_generator.cc"
                     ,0xb9);
          poVar2 = std::operator<<((ostream *)&b._M_string_length,"Bad operator: ");
          std::operator<<(poVar2,(string *)
                                 ((long)&(((post->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar8));
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&b);
          pbVar7 = (post->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          goto LAB_001074e3;
        }
        pbVar4 = regexps.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (regexps.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            regexps.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar4 = regexps.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        std::__cxx11::string::string((string *)&b,(string *)(pbVar4 + -1));
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&regexps.c);
        pbVar4 = regexps.c.
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (regexps.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            regexps.c.
            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pbVar4 = regexps.c.
                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
        }
        std::__cxx11::string::string((string *)&a,(string *)(pbVar4 + -1));
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(&regexps.c);
        StringPrintf_abi_cxx11_
                  (&local_1f0,
                   *(char **)((long)&(((post->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar8),a._M_dataplus._M_p,b._M_dataplus._M_p);
        std::operator+(&local_210,"(?:",&local_1f0);
        std::operator+(&local_1d0,&local_210,")");
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&regexps,
                   &local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&local_1f0);
        __return_storage_ptr__ = &a;
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&b);
    }
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 0x20;
  } while( true );
}

Assistant:

void RegexpGenerator::RunPostfix(const vector<string>& post) {
  stack<string> regexps;
  for (size_t i = 0; i < post.size(); i++) {
    switch (CountArgs(post[i])) {
      default:
        LOG(FATAL) << "Bad operator: " << post[i];
      case 0:
        regexps.push(post[i]);
        break;
      case 1: {
        string a = regexps.top();
        regexps.pop();
        regexps.push("(?:" + StringPrintf(post[i].c_str(), a.c_str()) + ")");
        break;
      }
      case 2: {
        string b = regexps.top();
        regexps.pop();
        string a = regexps.top();
        regexps.pop();
        regexps.push("(?:" +
                     StringPrintf(post[i].c_str(), a.c_str(), b.c_str()) +
                     ")");
        break;
      }
    }
  }

  if (regexps.size() != 1) {
    // Internal error - should never happen.
    printf("Bad regexp program:\n");
    for (size_t i = 0; i < post.size(); i++) {
      printf("  %s\n", CEscape(post[i]).c_str());
    }
    printf("Stack after running program:\n");
    while (!regexps.empty()) {
      printf("  %s\n", CEscape(regexps.top()).c_str());
      regexps.pop();
    }
    LOG(FATAL) << "Bad regexp program.";
  }

  HandleRegexp(regexps.top());
  HandleRegexp("^(?:" + regexps.top() + ")$");
  HandleRegexp("^(?:" + regexps.top() + ")");
  HandleRegexp("(?:" + regexps.top() + ")$");
}